

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockIgnoredExpectedCall_worksAsItShould_Test::
~TEST_MockIgnoredExpectedCall_worksAsItShould_Test
          (TEST_MockIgnoredExpectedCall_worksAsItShould_Test *this)

{
  TEST_MockIgnoredExpectedCall_worksAsItShould_Test *this_local;
  
  ~TEST_MockIgnoredExpectedCall_worksAsItShould_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MockIgnoredExpectedCall, worksAsItShould)
{
    ignored.withName("func");
    ignored.withCallOrder(1);
    ignored.withCallOrder(1, 1);
    ignored.onObject(NULLPTR);
    ignored.withBoolParameter("umm", true);
    ignored.withIntParameter("bla", (int) 1);
    ignored.withUnsignedIntParameter("foo", (unsigned int) 1);
    ignored.withLongIntParameter("hey", (long int) 1);
    ignored.withUnsignedLongIntParameter("bah", (unsigned long int) 1);
#if CPPUTEST_USE_LONG_LONG
    ignored.withLongLongIntParameter("yo", (long long int) 1);
    ignored.withUnsignedLongLongIntParameter("grr", (unsigned long long int) 1);
#endif
    ignored.withDoubleParameter("hah", (double) 1.1f);
    ignored.withDoubleParameter("gah", 2.1, 0.3);
    ignored.withStringParameter("goo", "hello");
    ignored.withPointerParameter("pie", (void*) NULLPTR);
    ignored.withConstPointerParameter("woo", (const void*) NULLPTR);
    ignored.withFunctionPointerParameter("fop", (void(*)()) NULLPTR);
    ignored.withMemoryBufferParameter("waa", (const unsigned char*) NULLPTR, 0);
    ignored.withParameterOfType( "mytype", "top", (const void*) NULLPTR);
    ignored.withOutputParameterReturning("bar", (void*) NULLPTR, 1);
    ignored.withOutputParameterOfTypeReturning("mytype", "bar", (const void*) NULLPTR);
    ignored.withUnmodifiedOutputParameter("unmod");
    ignored.ignoreOtherParameters();
    ignored.andReturnValue(true);
    ignored.andReturnValue((double) 1.0f);
    ignored.andReturnValue((unsigned int) 1);
    ignored.andReturnValue((int) 1);
    ignored.andReturnValue((unsigned long int) 1);
    ignored.andReturnValue((long int) 1);
#if CPPUTEST_USE_LONG_LONG
    ignored.andReturnValue((unsigned long long int) 1);
    ignored.andReturnValue((long long int) 1);
#endif
    ignored.andReturnValue("boo");
    ignored.andReturnValue((void*) NULLPTR);
    ignored.andReturnValue((const void*) NULLPTR);
    ignored.andReturnValue((void(*)()) NULLPTR);
}